

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

InterpKernel * choose_interp_filter(int in_length,int out_length)

{
  InterpKernel *paiVar1;
  int iVar2;
  
  if (in_length <= out_length) {
    return av1_resize_filter_normative;
  }
  iVar2 = out_length * 0x10;
  if (SBORROW4(iVar2,in_length * 0xd) != iVar2 + in_length * -0xd < 0) {
    if (SBORROW4(iVar2,in_length * 0xb) != iVar2 + in_length * -0xb < 0) {
      paiVar1 = filteredinterp_filters625;
      if (SBORROW4(iVar2,in_length * 9) != iVar2 + in_length * -9 < 0) {
        paiVar1 = filteredinterp_filters500;
      }
      return paiVar1;
    }
    return filteredinterp_filters750;
  }
  return filteredinterp_filters875;
}

Assistant:

static const InterpKernel *choose_interp_filter(int in_length, int out_length) {
  int out_length16 = out_length * 16;
  if (out_length16 >= in_length * 16)
    return filteredinterp_filters1000;
  else if (out_length16 >= in_length * 13)
    return filteredinterp_filters875;
  else if (out_length16 >= in_length * 11)
    return filteredinterp_filters750;
  else if (out_length16 >= in_length * 9)
    return filteredinterp_filters625;
  else
    return filteredinterp_filters500;
}